

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::IFF_PDU::ClearLayers(IFF_PDU *this)

{
  IFF_PDU *this_local;
  
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
  ::clear(&this->m_vLayers);
  (this->super_Header).super_Header6.m_ui16PDULength = 0x3c;
  return;
}

Assistant:

void IFF_PDU::ClearLayers()
{
	m_vLayers.clear();
	m_ui16PDULength = IFF_PDU_SIZE;
}